

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_long,void>
          (XmlWriter *this,StringRef name,unsigned_long *attribute)

{
  StringRef attribute_00;
  XmlWriter *pXVar1;
  size_type in_RDX;
  char *in_RSI;
  ReusableStringStream rss;
  string *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string local_88 [40];
  XmlWriter *in_stack_ffffffffffffffa0;
  StringRef in_stack_ffffffffffffffb8;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff60);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(unsigned_long *)in_stack_ffffffffffffff58);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff58);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  attribute_00.m_size = in_RDX;
  attribute_00.m_start = in_RSI;
  pXVar1 = writeAttribute(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb8,attribute_00);
  std::__cxx11::string::~string(local_88);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)in_stack_ffffffffffffffa0);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( StringRef name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }